

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void __thiscall diy::MemoryBuffer::MemoryBuffer(MemoryBuffer *this,size_t position_)

{
  _func_int **in_RSI;
  BinaryBuffer *in_RDI;
  
  BinaryBuffer::BinaryBuffer(in_RDI);
  in_RDI->_vptr_BinaryBuffer = (_func_int **)&PTR__MemoryBuffer_001f01f0;
  in_RDI[1]._vptr_BinaryBuffer = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x19be50);
  in_RDI[5]._vptr_BinaryBuffer = (_func_int **)0x0;
  std::vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_>::vector
            ((vector<diy::BinaryBlob,_std::allocator<diy::BinaryBlob>_> *)0x19be65);
  return;
}

Assistant:

MemoryBuffer(size_t position_ = 0):
                          position(position_)                       {}